

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseLogicalNot(Parser *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  regex *in_RSI;
  Parser *in_RDI;
  shared_ptr<minja::Expression> sVar4;
  shared_ptr<minja::Expression> sub;
  Location location;
  Parser *in_stack_000000f8;
  shared_ptr<minja::UnaryOpExpr> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  Op *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  flag_type in_stack_ffffffffffffff94;
  Location *in_stack_ffffffffffffff98;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffffa0;
  Parser *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffe8;
  SpaceHandling in_stack_ffffffffffffffec;
  Parser *this_01;
  
  this_01 = in_RDI;
  if (parseLogicalNot()::not_tok_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&parseLogicalNot()::not_tok_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff94);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseLogicalNot()::not_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseLogicalNot()::not_tok_abi_cxx11_);
    }
  }
  get_location(in_stack_ffffffffffffffa8);
  consumeToken(this_01,in_RSI,in_stack_ffffffffffffffec);
  bVar1 = std::__cxx11::string::empty();
  bVar1 = bVar1 ^ 0xff;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  if ((bVar1 & 1) == 0) {
    parseLogicalCompare(in_stack_000000f8);
  }
  else {
    parseLogicalNot((Parser *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffff98);
    if (!bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Expected expression after \'not\' keyword");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    make_shared<minja::UnaryOpExpr,minja::Location&,std::shared_ptr<minja::Expression>,minja::UnaryOpExpr::Op>
              (in_stack_ffffffffffffff98,
               (shared_ptr<minja::Expression> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    std::shared_ptr<minja::Expression>::shared_ptr<minja::UnaryOpExpr,void>
              ((shared_ptr<minja::Expression> *)CONCAT17(bVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    std::shared_ptr<minja::UnaryOpExpr>::~shared_ptr((shared_ptr<minja::UnaryOpExpr> *)0x2f9411);
    std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f9423);
  }
  Location::~Location((Location *)0x2f9454);
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<minja::Expression>)
         sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseLogicalNot() {
        static std::regex not_tok(R"(not\b)");
        auto location = get_location();

        if (!consumeToken(not_tok).empty()) {
          auto sub = parseLogicalNot();
          if (!sub) throw std::runtime_error("Expected expression after 'not' keyword");
          return std::make_shared<UnaryOpExpr>(location, std::move(sub), UnaryOpExpr::Op::LogicalNot);
        }
        return parseLogicalCompare();
    }